

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkparse.c
# Opt level: O0

int pk_group_id_from_specified(mbedtls_asn1_buf *params,mbedtls_ecp_group_id *grp_id)

{
  undefined1 local_118 [8];
  mbedtls_ecp_group grp;
  int ret;
  mbedtls_ecp_group_id *grp_id_local;
  mbedtls_asn1_buf *params_local;
  
  grp.T_size._4_4_ = 0xffffff92;
  mbedtls_ecp_group_init((mbedtls_ecp_group *)local_118);
  grp.T_size._4_4_ = pk_group_from_specified(params,(mbedtls_ecp_group *)local_118);
  if (grp.T_size._4_4_ == 0) {
    grp.T_size._4_4_ = pk_group_id_from_group((mbedtls_ecp_group *)local_118,grp_id);
  }
  mbedtls_ecp_group_free((mbedtls_ecp_group *)local_118);
  return grp.T_size._4_4_;
}

Assistant:

static int pk_group_id_from_specified( const mbedtls_asn1_buf *params,
                                       mbedtls_ecp_group_id *grp_id )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_ecp_group grp;

    mbedtls_ecp_group_init( &grp );

    if( ( ret = pk_group_from_specified( params, &grp ) ) != 0 )
        goto cleanup;

    ret = pk_group_id_from_group( &grp, grp_id );

cleanup:
    mbedtls_ecp_group_free( &grp );

    return( ret );
}